

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O0

void pybind11::class_<Job,_std::shared_ptr<Job>_>::dealloc(PyObject *inst_)

{
  instance_type *inst;
  PyObject *inst__local;
  
  if (((byte)inst_[2].ob_refcnt >> 1 & 1) == 0) {
    if ((inst_[2].ob_refcnt & 1) != 0) {
      operator_delete((void *)inst_[1].ob_refcnt);
    }
  }
  else {
    std::shared_ptr<Job>::~shared_ptr((shared_ptr<Job> *)&inst_[2].ob_type);
  }
  detail::generic_type::dealloc
            ((instance<void,_std::unique_ptr<void,_std::default_delete<void>_>_> *)inst_);
  return;
}

Assistant:

static void dealloc(PyObject *inst_) {
        instance_type *inst = (instance_type *) inst_;
        if (inst->holder_constructed)
            inst->holder.~holder_type();
        else if (inst->owned)
            ::operator delete(inst->value);

        generic_type::dealloc((detail::instance<void> *) inst);
    }